

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

string * __thiscall
zmq::socket_base_t::resolve_tcp_addr
          (socket_base_t *this,string *endpoint_uri_pair_,char *tcp_address_)

{
  bool bVar1;
  void *pvVar2;
  string *in_RDX;
  string *in_RDI;
  int rc;
  bool in_stack_0000005e;
  bool in_stack_0000005f;
  char *in_stack_00000060;
  tcp_address_t *in_stack_00000068;
  tcp_address_t *tcp_addr;
  string *in_stack_000003d0;
  tcp_address_t *in_stack_000003d8;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
  *in_stack_ffffffffffffff58;
  tcp_address_t *in_stack_ffffffffffffff60;
  void *local_90;
  _Self local_68;
  _Self local_60;
  int local_58;
  undefined1 local_41;
  void *local_40;
  void *local_38;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x2d390a);
  local_30._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    pvVar2 = operator_new(0x3c,(nothrow_t *)&std::nothrow);
    local_41 = 0;
    local_90 = (void *)0x0;
    if (pvVar2 != (void *)0x0) {
      local_41 = 1;
      local_40 = pvVar2;
      tcp_address_t::tcp_address_t(in_stack_ffffffffffffff60);
      local_90 = pvVar2;
    }
    local_38 = local_90;
    if (local_90 == (void *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
              ,0x46a);
      fflush(_stderr);
      zmq_abort((char *)0x2d39ea);
    }
    local_58 = tcp_address_t::resolve
                         (in_stack_00000068,in_stack_00000060,in_stack_0000005f,in_stack_0000005e);
    if (local_58 == 0) {
      tcp_address_t::to_string(in_stack_000003d8,in_stack_000003d0);
      local_60._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
           ::find(in_stack_ffffffffffffff58,(key_type *)0x2d3a73);
      local_68._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
           ::end(in_stack_ffffffffffffff58);
      bVar1 = std::operator==(&local_60,&local_68);
      if ((bVar1) &&
         (local_58 = tcp_address_t::resolve
                               (in_stack_00000068,in_stack_00000060,in_stack_0000005f,
                                in_stack_0000005e), local_58 == 0)) {
        tcp_address_t::to_string(in_stack_000003d8,in_stack_000003d0);
      }
    }
    if (local_38 != (void *)0x0) {
      operator_delete(local_38,0x3c);
    }
    local_38 = (void *)0x0;
  }
  std::__cxx11::string::string((string *)in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

std::string
zmq::socket_base_t::resolve_tcp_addr (std::string endpoint_uri_pair_,
                                      const char *tcp_address_)
{
    // The resolved last_endpoint is used as a key in the endpoints map.
    // The address passed by the user might not match in the TCP case due to
    // IPv4-in-IPv6 mapping (EG: tcp://[::ffff:127.0.0.1]:9999), so try to
    // resolve before giving up. Given at this stage we don't know whether a
    // socket is connected or bound, try with both.
    if (_endpoints.find (endpoint_uri_pair_) == _endpoints.end ()) {
        tcp_address_t *tcp_addr = new (std::nothrow) tcp_address_t ();
        alloc_assert (tcp_addr);
        int rc = tcp_addr->resolve (tcp_address_, false, options.ipv6);

        if (rc == 0) {
            tcp_addr->to_string (endpoint_uri_pair_);
            if (_endpoints.find (endpoint_uri_pair_) == _endpoints.end ()) {
                rc = tcp_addr->resolve (tcp_address_, true, options.ipv6);
                if (rc == 0) {
                    tcp_addr->to_string (endpoint_uri_pair_);
                }
            }
        }
        LIBZMQ_DELETE (tcp_addr);
    }
    return endpoint_uri_pair_;
}